

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

void IoTHubClientCore_LL_SendComplete
               (PDLIST_ENTRY completed,IOTHUB_CLIENT_CONFIRMATION_RESULT result,void *ctx)

{
  LOGGER_LOG p_Var1;
  PDLIST_ENTRY pDVar2;
  IOTHUB_MESSAGE_LIST *messageList;
  PDLIST_ENTRY oldest;
  LOGGER_LOG l;
  void *ctx_local;
  IOTHUB_CLIENT_CONFIRMATION_RESULT result_local;
  PDLIST_ENTRY completed_local;
  
  if ((ctx == (void *)0x0) || (completed == (PDLIST_ENTRY)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_SendComplete",0x21f,1,"invalid arg");
    }
  }
  else {
    while (pDVar2 = DList_RemoveHeadList(completed), pDVar2 != completed) {
      if (pDVar2[-1].Flink != (DLIST_ENTRY_TAG *)0x0) {
        (*(code *)pDVar2[-1].Flink)(result,pDVar2[-1].Blink);
      }
      IoTHubMessage_Destroy((IOTHUB_MESSAGE_HANDLE)pDVar2[-2].Blink);
      free(&pDVar2[-2].Blink);
    }
  }
  return;
}

Assistant:

static void IoTHubClientCore_LL_SendComplete(PDLIST_ENTRY completed, IOTHUB_CLIENT_CONFIRMATION_RESULT result, void* ctx)
{
    if (
        (ctx == NULL) ||
        (completed == NULL)
        )
    {
        /*"shall return"*/
        LogError("invalid arg");
    }
    else
    {
        PDLIST_ENTRY oldest;
        while ((oldest = DList_RemoveHeadList(completed)) != completed)
        {
            IOTHUB_MESSAGE_LIST* messageList = (IOTHUB_MESSAGE_LIST*)containingRecord(oldest, IOTHUB_MESSAGE_LIST, entry);
            if (messageList->callback != NULL)
            {
                messageList->callback(result, messageList->context);
            }
            IoTHubMessage_Destroy(messageList->messageHandle);
            free(messageList);
        }
    }
}